

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

void __thiscall
cmFindLibraryCommand::AddArchitecturePath
          (cmFindLibraryCommand *this,string *dir,size_type start_pos,char *suffix,bool fresh)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  string lib;
  string libX;
  string local_50 [32];
  
  lVar3 = std::__cxx11::string::find((char *)dir,0x5363fe);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)&lib,(ulong)dir);
    bVar1 = cmsys::SystemTools::FileIsDirectory(&lib);
    std::operator+(&libX,&lib,suffix);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&libX);
    if (bVar1 && bVar2) {
      bVar2 = cmLibDirsLinked(&libX,&lib);
      if (!bVar2) {
LAB_0030ed86:
        std::__cxx11::string::substr((ulong)local_50,(ulong)dir);
        std::__cxx11::string::append((string *)&libX);
        std::__cxx11::string::~string(local_50);
        sVar4 = strlen(suffix);
        AddArchitecturePath(this,&libX,lVar3 + sVar4 + 4,suffix,true);
      }
    }
    else if (bVar2) goto LAB_0030ed86;
    if (bVar1) {
      AddArchitecturePath(this,dir,lVar3 + 4,suffix,false);
    }
    std::__cxx11::string::~string((string *)&libX);
    std::__cxx11::string::~string((string *)&lib);
  }
  if (!fresh) {
    return;
  }
  bVar1 = cmsys::SystemTools::FileIsDirectory(dir);
  std::operator+(&lib,dir,suffix);
  bVar2 = cmsys::SystemTools::FileIsDirectory(&lib);
  if (bVar1 && bVar2) {
    bVar2 = cmLibDirsLinked(&lib,dir);
    if (bVar2) goto LAB_0030ee7d;
  }
  else if (!bVar2) goto LAB_0030ee7d;
  std::__cxx11::string::append((char *)&lib);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,&lib);
LAB_0030ee7d:
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,dir);
  }
  std::__cxx11::string::~string((string *)&lib);
  return;
}

Assistant:

void cmFindLibraryCommand::AddArchitecturePath(
  std::string const& dir, std::string::size_type start_pos, const char* suffix,
  bool fresh)
{
  std::string::size_type pos = dir.find("lib/", start_pos);

  if (pos != std::string::npos) {
    // Check for "lib".
    std::string lib = dir.substr(0, pos + 3);
    bool use_lib = cmSystemTools::FileIsDirectory(lib);

    // Check for "lib<suffix>" and use it first.
    std::string libX = lib + suffix;
    bool use_libX = cmSystemTools::FileIsDirectory(libX);

    // Avoid copies of the same directory due to symlinks.
    if (use_libX && use_lib && cmLibDirsLinked(libX, lib)) {
      use_libX = false;
    }

    if (use_libX) {
      libX += dir.substr(pos + 3);
      std::string::size_type libX_pos = pos + 3 + strlen(suffix) + 1;
      this->AddArchitecturePath(libX, libX_pos, suffix);
    }

    if (use_lib) {
      this->AddArchitecturePath(dir, pos + 3 + 1, suffix, false);
    }
  }

  if (fresh) {
    // Check for the original unchanged path.
    bool use_dir = cmSystemTools::FileIsDirectory(dir);

    // Check for <dir><suffix>/ and use it first.
    std::string dirX = dir + suffix;
    bool use_dirX = cmSystemTools::FileIsDirectory(dirX);

    // Avoid copies of the same directory due to symlinks.
    if (use_dirX && use_dir && cmLibDirsLinked(dirX, dir)) {
      use_dirX = false;
    }

    if (use_dirX) {
      dirX += "/";
      this->SearchPaths.push_back(dirX);
    }

    if (use_dir) {
      this->SearchPaths.push_back(dir);
    }
  }
}